

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_bde.c
# Opt level: O0

void beltBDEStepE(void *buf,size_t count,void *state)

{
  u32 *in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  belt_bde_st *st;
  size_t in_stack_ffffffffffffffd8;
  ulong local_10;
  ulong *local_8;
  
  local_8 = in_RDI;
  for (local_10 = in_RSI; 0xf < local_10; local_10 = local_10 - 0x10) {
    beltBlockMulC(in_RDX + 8);
    u32To(in_RDX,in_stack_ffffffffffffffd8,(u32 *)0x148863);
    *local_8 = *(ulong *)(in_RDX + 0xc) ^ *local_8;
    local_8[1] = *(ulong *)(in_RDX + 0xe) ^ local_8[1];
    beltBlockEncr((octet *)local_8,in_RDX);
    *local_8 = *(ulong *)(in_RDX + 0xc) ^ *local_8;
    local_8[1] = *(ulong *)(in_RDX + 0xe) ^ local_8[1];
    local_8 = local_8 + 2;
  }
  return;
}

Assistant:

void beltBDEStepE(void* buf, size_t count, void* state)
{
	belt_bde_st* st = (belt_bde_st*)state;
	ASSERT(count % 16 == 0);
	ASSERT(memIsDisjoint2(buf, count, state, beltBDE_keep()));
	// цикл по блокам
	while(count >= 16)
	{
		beltBlockMulC(st->s);
		u32To(st->block, 16, st->s);
		beltBlockXor2(buf, st->block);
		beltBlockEncr(buf, st->key);
		beltBlockXor2(buf, st->block);
		buf = (octet*)buf + 16;
		count -= 16;
	}
}